

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void prvTidyFreeNode(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  
  while (node != (Node *)0x0) {
    pNVar1 = node->next;
    prvTidyFreeAttrs(doc,node);
    prvTidyFreeNode(doc,node->content);
    (*doc->allocator->vtbl->free)(doc->allocator,node->element);
    if (node->type == RootNode) {
      node->content = (Node *)0x0;
      node = pNVar1;
    }
    else {
      (*doc->allocator->vtbl->free)(doc->allocator,node);
      node = pNVar1;
    }
  }
  return;
}

Assistant:

void TY_(FreeNode)( TidyDocImpl* doc, Node *node )
{
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_ALLOCATION)
    /* avoid showing free of root node! */
    if (node) {
        if (RootNode != node->type) {
            SPRTF("Free node %p\n", node);
        }
        else {
            SPRTF("Root node %p\n", node);
        }
    }
#endif

    while ( node )
    {
        Node* next = node->next;

        TY_(FreeAttrs)( doc, node );
        TY_(FreeNode)( doc, node->content );
        TidyDocFree( doc, node->element );
        if (RootNode != node->type)
            TidyDocFree( doc, node );
        else
            node->content = NULL;

        node = next;
    }
}